

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O2

bool __thiscall
cmUseMangledMesaCommand::InitialPass
          (cmUseMangledMesaCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  char *path;
  bool bVar1;
  bool bVar2;
  string *this_00;
  pointer pbVar3;
  allocator local_b2;
  allocator local_b1;
  char *local_b0;
  string e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string glh;
  string local_50;
  
  bVar1 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0030,
                     "The use_mangled_mesa command should not be called; see CMP0030.");
  bVar2 = true;
  if (!bVar1) {
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 == 0x40) {
      local_b0 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::string((string *)&glh,local_b0,(allocator *)&e);
      std::__cxx11::string::append((char *)&glh);
      std::__cxx11::string::append((char *)&glh);
      bVar2 = cmsys::SystemTools::FileExists(glh._M_dataplus._M_p);
      if (bVar2) {
        path = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&e,local_b0,&local_b1);
        std::__cxx11::string::string((string *)&local_50,"\\.h$",&local_b2);
        cmSystemTools::Glob(&e,&local_50,&files);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&e);
        bVar2 = files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          cmSystemTools::Error("Could not open Mesa Directory ",local_b0,(char *)0x0,(char *)0x0);
        }
        else {
          cmsys::SystemTools::MakeDirectory(path);
          for (pbVar3 = files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar3 != files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
            std::__cxx11::string::string((string *)&e,local_b0,(allocator *)&local_50);
            std::__cxx11::string::append((char *)&e);
            this_00 = &e;
            std::__cxx11::string::append((string *)&e);
            CopyAndFullPathMesaHeader((cmUseMangledMesaCommand *)this_00,e._M_dataplus._M_p,path);
            std::__cxx11::string::~string((string *)&e);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&files);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&e,"Bad path to Mesa, could not find: ",(allocator *)&local_50);
        std::__cxx11::string::append((string *)&e);
        std::__cxx11::string::append((char *)&e);
        cmCommand::SetError(&this->super_cmCommand,&e);
        std::__cxx11::string::~string((string *)&e);
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&glh);
    }
    else {
      std::__cxx11::string::string
                ((string *)&glh,"called with incorrect number of arguments",(allocator *)&e);
      cmCommand::SetError(&this->super_cmCommand,&glh);
      std::__cxx11::string::~string((string *)&glh);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmUseMangledMesaCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0030,
      "The use_mangled_mesa command should not be called; see CMP0030."))
    { return true; }
  // expected two arguments:
  // arguement one: the full path to gl_mangle.h
  // arguement two : directory for output of edited headers
  if(args.size() != 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  const char* inputDir = args[0].c_str();
  std::string glh = inputDir;
  glh += "/";
  glh += "gl.h";
  if(!cmSystemTools::FileExists(glh.c_str()))
    {
    std::string e = "Bad path to Mesa, could not find: ";
    e += glh;
    e += " ";
    this->SetError(e);
    return false;
    }
  const char* destDir = args[1].c_str();
  std::vector<std::string> files;
  cmSystemTools::Glob(inputDir, "\\.h$", files);
  if(files.empty())
    {
    cmSystemTools::Error("Could not open Mesa Directory ", inputDir);
    return false;
    }
  cmSystemTools::MakeDirectory(destDir);
  for(std::vector<std::string>::iterator i = files.begin();
      i != files.end(); ++i)
    {
    std::string path = inputDir;
    path += "/";
    path += *i;
    this->CopyAndFullPathMesaHeader(path.c_str(), destDir);
    }

  return true;
}